

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

int __thiscall
TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::ClassId
          (TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  allocator<char> aStack_1fb31;
  string sStack_1fb30;
  TPZFrontSym<double> TStack_1fb10;
  TPZStackEqnStorage<double> TStack_1f9e8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_1fb30,"TPZFrontMatrix",&aStack_1fb31);
  uVar1 = Hash(&sStack_1fb30);
  iVar2 = TPZAbstractFrontMatrix<double>::ClassId(&this->super_TPZAbstractFrontMatrix<double>);
  TPZStackEqnStorage<double>::TPZStackEqnStorage(&TStack_1f9e8);
  iVar3 = TPZStackEqnStorage<double>::ClassId(&TStack_1f9e8);
  TPZFrontSym<double>::TPZFrontSym(&TStack_1fb10);
  iVar4 = TPZFrontSym<double>::ClassId(&TStack_1fb10);
  TPZFrontSym<double>::~TPZFrontSym(&TStack_1fb10);
  TPZStackEqnStorage<double>::~TPZStackEqnStorage(&TStack_1f9e8);
  std::__cxx11::string::~string((string *)&sStack_1fb30);
  return iVar4 << 3 ^ iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::ClassId() const{
    return Hash("TPZFrontMatrix") ^ TPZAbstractFrontMatrix<TVar>::ClassId() << 1 ^ store().ClassId() << 2 ^ front().ClassId() << 3;
}